

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_utils.cc
# Opt level: O3

bool sptk::ComputeProbabilityOfTDistribution
               (double percentage_point,int degrees_of_freedom,double *probability)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  uint uVar3;
  double dVar4;
  ulong in_XMM0_Qb;
  ulong uVar5;
  ulong extraout_XMM0_Qb;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  double dVar10;
  
  if (probability != (double *)0x0 && 0 < degrees_of_freedom) {
    dVar10 = (double)degrees_of_freedom;
    dVar9 = dVar10 / (percentage_point * percentage_point + dVar10);
    uVar5 = 0;
    dVar4 = 1.0 - dVar9;
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
      in_XMM0_Qb = 0;
      uVar5 = extraout_XMM0_Qb;
    }
    else {
      dVar4 = SQRT(dVar4);
    }
    dVar8 = 0.0;
    uVar3 = (degrees_of_freedom & 1U) + 2;
    if (uVar3 <= (uint)degrees_of_freedom) {
      uVar2 = (uVar5 ^ 0x8000000000000000) & in_XMM0_Qb;
      auVar6._0_8_ = ~-(ulong)(percentage_point < 0.0) & (ulong)dVar4;
      auVar6._8_8_ = ~in_XMM0_Qb & uVar5;
      auVar1._8_4_ = (int)uVar2;
      auVar1._0_8_ = (ulong)-dVar4 & -(ulong)(percentage_point < 0.0);
      auVar1._12_4_ = (int)(uVar2 >> 0x20);
      auVar7 = auVar6 | auVar1;
      do {
        dVar8 = dVar8 + auVar7._0_8_;
        auVar7._0_8_ = auVar7._0_8_ * (((double)(int)(uVar3 - 1) * dVar9) / (double)(int)uVar3);
        uVar3 = uVar3 + 2;
      } while ((int)uVar3 <= degrees_of_freedom);
    }
    if ((degrees_of_freedom & 1U) == 0) {
      dVar4 = (dVar8 + 1.0) * 0.5;
    }
    else {
      if (dVar10 < 0.0) {
        dVar10 = sqrt(dVar10);
      }
      else {
        dVar10 = SQRT(dVar10);
      }
      dVar4 = atan(percentage_point / dVar10);
      dVar4 = (dVar8 * SQRT(dVar9) + dVar4) / 3.141592653589793 + 0.5;
    }
    *probability = dVar4;
  }
  return probability != (double *)0x0 && 0 < degrees_of_freedom;
}

Assistant:

bool ComputeProbabilityOfTDistribution(double percentage_point,
                                       int degrees_of_freedom,
                                       double* probability) {
  if (degrees_of_freedom <= 0 || NULL == probability) {
    return false;
  }

  const double cosine_squared(
      degrees_of_freedom /
      (degrees_of_freedom + percentage_point * percentage_point));
  const double sine((percentage_point < 0.0) ? -std::sqrt(1.0 - cosine_squared)
                                             : std::sqrt(1.0 - cosine_squared));

  double sum(0.0);
  double prod(sine);
  for (int i(degrees_of_freedom % 2 + 2); i <= degrees_of_freedom; i += 2) {
    sum += prod;
    prod *= (i - 1) * cosine_squared / i;
  }
  if (0 == degrees_of_freedom % 2) {
    *probability = (1.0 + sum) / 2.0;
  } else {
    const double theta(
        std::atan(percentage_point / std::sqrt(degrees_of_freedom)));
    *probability = 0.5 + (sum * std::sqrt(cosine_squared) + theta) / sptk::kPi;
  }

  return true;
}